

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4to1.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel_pack4to1_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  undefined4 *puVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Allocator *pAVar21;
  void *pvVar22;
  undefined8 *puVar23;
  Allocator *pAVar24;
  long lVar25;
  long lVar26;
  Allocator *pAVar27;
  Allocator *pAVar28;
  ulong uVar29;
  Allocator *pAVar30;
  Allocator *pAVar31;
  ulong uVar32;
  Allocator *pAVar33;
  int j;
  Allocator *pAVar34;
  ulong uVar35;
  long lVar36;
  int k;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [32];
  float fVar48;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float tmp [8] [3];
  long local_1c0;
  Mat local_198;
  ulong local_148;
  long local_140;
  ulong local_138;
  void *local_130;
  long local_128;
  long local_120;
  ulong local_118;
  long local_110;
  long local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  Allocator *local_e0;
  long local_d8;
  void *local_d0;
  Allocator *local_c8;
  Allocator *local_c0;
  Allocator *local_b8;
  Allocator *local_b0;
  Allocator *local_a8;
  Allocator *local_a0;
  float fStack_98;
  undefined8 auStack_94 [3];
  undefined1 auStack_78 [72];
  
  uVar35 = (ulong)(uint)outch;
  local_198.cstep = 0;
  local_198.data = (Allocator *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize._0_4_ = 0;
  local_198.elempack = 0;
  local_198._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_198.elemsize._4_4_ = (int)local_198.refcount;
  local_198.allocator = (Allocator *)local_198.data;
  local_198.dims = (int)local_198.refcount;
  local_198.w = local_198.refcount._4_4_;
  local_198.c = local_198.elempack;
  Mat::create(&local_198,0x40,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_00553380;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar29 = 0;
    pAVar27 = (Allocator *)local_198.data;
    do {
      if (0 < inch) {
        iVar17 = inch * 9 * (int)uVar29;
        uVar32 = 0;
        pAVar28 = pAVar27;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar32 * 0x24 + (long)iVar17 * 4 + 0x20);
          lVar20 = 0;
          do {
            auVar39 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00553500 + lVar20)),
                                    ZEXT416(*(uint *)((long)&DAT_0055350c + lVar20)),0x10);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_00553518 + lVar20)),0x20);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_00553524 + lVar20)),0x30);
            auVar54 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00553504 + lVar20)),
                                    ZEXT416(*(uint *)((long)&DAT_00553510 + lVar20)),0x10);
            auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)&DAT_0055351c + lVar20)),0x20);
            auVar54 = vinsertps_avx(auVar54,ZEXT416(*(uint *)((long)&DAT_00553528 + lVar20)),0x30);
            fVar38 = auVar39._0_4_;
            fVar40 = auVar39._4_4_;
            fVar41 = auVar39._8_4_;
            fVar42 = auVar39._12_4_;
            fVar43 = auVar54._0_4_;
            fVar45 = auVar54._4_4_;
            fVar46 = auVar54._8_4_;
            fVar47 = auVar54._12_4_;
            auVar39 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00553508 + lVar20)),
                                    ZEXT416(*(uint *)((long)&DAT_00553510 + lVar20 + 4)),0x10);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_00553520 + lVar20)),0x20);
            auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)((long)&DAT_0055352c + lVar20)),0x30);
            fVar48 = auVar39._0_4_;
            fVar51 = auVar39._4_4_;
            fVar52 = auVar39._8_4_;
            fVar53 = auVar39._12_4_;
            auVar54._0_4_ = fVar43 * fVar2 + fVar38 * fVar1 + fVar48 * fVar3;
            auVar54._4_4_ = fVar45 * fVar2 + fVar40 * fVar1 + fVar51 * fVar3;
            auVar54._8_4_ = fVar46 * fVar2 + fVar41 * fVar1 + fVar52 * fVar3;
            auVar54._12_4_ = fVar47 * fVar2 + fVar42 * fVar1 + fVar53 * fVar3;
            auVar55._0_4_ = fVar43 * fVar5 + fVar38 * fVar4 + fVar48 * fVar6;
            auVar55._4_4_ = fVar45 * fVar5 + fVar40 * fVar4 + fVar51 * fVar6;
            auVar55._8_4_ = fVar46 * fVar5 + fVar41 * fVar4 + fVar52 * fVar6;
            auVar55._12_4_ = fVar47 * fVar5 + fVar42 * fVar4 + fVar53 * fVar6;
            auVar39._0_8_ =
                 CONCAT44(fVar8 * fVar45 + fVar40 * fVar7 + fVar9 * fVar51,
                          fVar8 * fVar43 + fVar38 * fVar7 + fVar9 * fVar48);
            auVar39._8_4_ = fVar8 * fVar46 + fVar41 * fVar7 + fVar9 * fVar52;
            auVar39._12_4_ = fVar8 * fVar47 + fVar42 * fVar7 + fVar9 * fVar53;
            auVar44._16_16_ = auVar55;
            auVar44._0_16_ = auVar54;
            auVar50 = vpermilps_avx(auVar44,auVar15);
            auVar49._16_16_ = auVar54;
            auVar49._0_16_ = auVar55;
            auVar44 = vmovsldup_avx(auVar49);
            auVar44 = vblendps_avx(auVar50,auVar44,0x42);
            auVar50._8_8_ = auVar39._0_8_;
            auVar50._0_8_ = auVar39._0_8_;
            auVar50._16_16_ = auVar39;
            auVar44 = vblendps_avx(auVar44,auVar50,0x24);
            auVar54 = vshufps_avx(auVar54,auVar55,0xff);
            auVar39 = vshufpd_avx(auVar39,auVar39,3);
            auVar39 = vblendps_avx(auVar39,auVar54,6);
            *(undefined1 (*) [16])(auStack_78 + lVar20) = auVar39;
            *(undefined1 (*) [32])((long)auStack_94 + lVar20 + -4) = auVar44;
            lVar20 = lVar20 + 0x30;
          } while (lVar20 != 0x60);
          lVar20 = 0;
          pAVar21 = pAVar28;
          do {
            fVar1 = *(float *)((long)auStack_94 + lVar20 * 0xc + -4);
            uVar10 = *(undefined8 *)((long)auStack_94 + lVar20 * 0xc);
            puVar23 = (undefined8 *)&DAT_00553504;
            lVar18 = 0;
            do {
              auVar37._0_4_ = (float)*puVar23 * (float)uVar10;
              auVar37._4_4_ = (float)((ulong)*puVar23 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar37._8_8_ = 0;
              auVar39 = vmovshdup_avx(auVar37);
              *(float *)((long)&pAVar21->_vptr_Allocator + lVar18 * 4) =
                   auVar37._0_4_ + fVar1 * *(float *)((long)puVar23 + -4) + auVar39._0_4_;
              lVar18 = lVar18 + 1;
              puVar23 = (undefined8 *)((long)puVar23 + 0xc);
            } while (lVar18 != 8);
            lVar20 = lVar20 + 1;
            pAVar21 = pAVar21 + 4;
          } while (lVar20 != 8);
          uVar32 = uVar32 + 1;
          pAVar28 = (Allocator *)
                    ((long)&pAVar28->_vptr_Allocator +
                    (long)local_198.w *
                    CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
        } while (uVar32 != (uint)inch);
      }
      uVar29 = uVar29 + 1;
      pAVar27 = (Allocator *)
                ((long)&pAVar27->_vptr_Allocator +
                local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize))
      ;
    } while (uVar29 != uVar35);
  }
  iVar17 = outch + 3;
  if (-1 < outch) {
    iVar17 = outch;
  }
  local_148 = uVar35;
  Mat::create(kernel_tm_pack4,inch,0x40,outch + (iVar17 >> 2) * -3,0x10,4,(Allocator *)0x0);
  uVar29 = 0;
  if (3 < outch) {
    lVar19 = (long)local_198.w;
    lVar26 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
    lVar18 = local_198.cstep * 3;
    lVar20 = lVar19 * 3;
    lVar36 = lVar26 * local_198.cstep;
    local_120 = kernel_tm_pack4->cstep * kernel_tm_pack4->elemsize;
    local_108 = (long)kernel_tm_pack4->w * kernel_tm_pack4->elemsize;
    lVar25 = lVar26 * lVar19;
    local_d0 = (void *)((long)(_func_int ***)local_198.data + lVar25 * 3);
    local_a0 = (Allocator *)
               ((long)(_func_int ***)local_198.data + (local_198.cstep + lVar19) * lVar26);
    local_a8 = (Allocator *)((long)(_func_int ***)local_198.data + (lVar18 + lVar19 * 2) * lVar26);
    local_b0 = (Allocator *)
               ((long)(_func_int ***)local_198.data + (lVar19 * 2 + local_198.cstep * 2) * lVar26);
    local_b8 = (Allocator *)
               ((long)(_func_int ***)local_198.data + (local_198.cstep + lVar19 * 2) * lVar26);
    local_d8 = lVar25 * 4;
    local_e0 = (Allocator *)((long)(_func_int ***)local_198.data + lVar25);
    local_e8 = (void *)((long)(_func_int ***)local_198.data + lVar25 * 2);
    local_f0 = (void *)((long)(_func_int ***)local_198.data + lVar36 * 3);
    local_128 = lVar36 * 4;
    local_f8 = (void *)((long)(_func_int ***)local_198.data + lVar36 * 2);
    local_c8 = (Allocator *)local_198.data;
    local_c0 = (Allocator *)((long)(_func_int ***)local_198.data + lVar36);
    local_130 = kernel_tm_pack4->data;
    lVar25 = 0;
    uVar29 = 0;
    do {
      local_118 = uVar29;
      local_110 = lVar25;
      local_100 = (void *)((local_118 >> 2) * local_120 + (long)local_130);
      local_1c0 = 0;
      local_140 = local_110;
      do {
        if (3 < inch) {
          puVar16 = (undefined4 *)(local_108 * local_1c0 + (long)local_100);
          lVar36 = 3;
          lVar25 = local_140;
          do {
            *puVar16 = *(undefined4 *)((long)(_func_int ***)local_198.data + lVar25);
            puVar16[1] = *(undefined4 *)((long)&local_c0->_vptr_Allocator + lVar25);
            puVar16[2] = *(undefined4 *)((long)local_f8 + lVar25);
            puVar16[3] = *(undefined4 *)((long)local_f0 + lVar25);
            puVar16[4] = *(undefined4 *)((long)&local_e0->_vptr_Allocator + lVar25);
            puVar16[5] = *(undefined4 *)((long)&local_a0->_vptr_Allocator + lVar25);
            puVar16[6] = *(undefined4 *)
                          ((long)(_func_int ***)local_198.data +
                          lVar25 + (lVar19 + local_198.cstep * 2) * lVar26);
            puVar16[7] = *(undefined4 *)
                          ((long)(_func_int ***)local_198.data + lVar25 + (lVar18 + lVar19) * lVar26
                          );
            puVar16[8] = *(undefined4 *)((long)local_e8 + lVar25);
            puVar16[9] = *(undefined4 *)((long)&local_b8->_vptr_Allocator + lVar25);
            puVar16[10] = *(undefined4 *)((long)&local_b0->_vptr_Allocator + lVar25);
            puVar16[0xb] = *(undefined4 *)((long)&local_a8->_vptr_Allocator + lVar25);
            puVar16[0xc] = *(undefined4 *)((long)local_d0 + lVar25);
            puVar16[0xd] = *(undefined4 *)
                            ((long)(_func_int ***)local_198.data +
                            lVar25 + (lVar20 + local_198.cstep) * lVar26);
            puVar16[0xe] = *(undefined4 *)
                            ((long)(_func_int ***)local_198.data +
                            lVar25 + (lVar20 + local_198.cstep * 2) * lVar26);
            puVar16[0xf] = *(undefined4 *)
                            ((long)(_func_int ***)local_198.data +
                            lVar25 + (lVar18 + lVar20) * lVar26);
            puVar16 = puVar16 + 0x10;
            lVar25 = lVar25 + local_d8;
            lVar36 = lVar36 + 4;
          } while (lVar36 < inch);
        }
        local_1c0 = local_1c0 + 1;
        local_140 = local_140 + 4;
      } while (local_1c0 != 0x40);
      uVar29 = local_118 + 4;
      lVar25 = local_110 + local_128;
    } while (local_118 + 7 < uVar35);
    outch = (int)local_148;
  }
  if ((int)uVar29 < outch) {
    lVar26 = (long)local_198.w;
    lVar20 = CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
    lVar25 = local_198.cstep * lVar20;
    iVar17 = kernel_tm_pack4->w;
    pvVar11 = kernel_tm_pack4->data;
    sVar12 = kernel_tm_pack4->elemsize;
    uVar32 = uVar29 & 0xffffffff;
    lVar18 = local_198.cstep * uVar32;
    pAVar28 = (Allocator *)((long)(_func_int ***)local_198.data + (lVar26 * 3 + lVar18) * lVar20);
    pAVar21 = (Allocator *)((long)(_func_int ***)local_198.data + (lVar18 + lVar26) * lVar20);
    pAVar31 = (Allocator *)((long)(_func_int ***)local_198.data + (lVar18 + lVar26 * 2) * lVar20);
    pAVar27 = (Allocator *)((long)(_func_int ***)local_198.data + lVar25 * uVar32);
    sVar13 = kernel_tm_pack4->cstep;
    do {
      pvVar22 = (void *)((ulong)(((uint)uVar29 & 3) + ((uint)(uVar29 >> 2) & 0x3fffffff)) *
                         sVar13 * sVar12 + (long)pvVar11);
      lVar18 = 0;
      pAVar24 = pAVar21;
      pAVar30 = pAVar28;
      pAVar33 = pAVar27;
      pAVar34 = pAVar31;
      do {
        if (3 < inch) {
          lVar19 = 3;
          lVar36 = 0;
          do {
            *(undefined4 *)((long)pvVar22 + lVar19 * 4 + -0xc) =
                 *(undefined4 *)((long)&pAVar33->_vptr_Allocator + lVar36 * 4);
            *(undefined4 *)((long)pvVar22 + lVar19 * 4 + -8) =
                 *(undefined4 *)((long)&pAVar24->_vptr_Allocator + lVar36 * 4);
            *(undefined4 *)((long)pvVar22 + lVar19 * 4 + -4) =
                 *(undefined4 *)((long)&pAVar34->_vptr_Allocator + lVar36 * 4);
            *(undefined4 *)((long)pvVar22 + lVar19 * 4) =
                 *(undefined4 *)((long)&pAVar30->_vptr_Allocator + lVar36 * 4);
            lVar36 = lVar36 + lVar20 * lVar26;
            lVar19 = lVar19 + 4;
          } while (lVar19 < inch);
        }
        lVar18 = lVar18 + 1;
        pAVar30 = (Allocator *)((long)&pAVar30->_vptr_Allocator + 4);
        pAVar24 = (Allocator *)((long)&pAVar24->_vptr_Allocator + 4);
        pAVar34 = (Allocator *)((long)&pAVar34->_vptr_Allocator + 4);
        pAVar33 = (Allocator *)((long)&pAVar33->_vptr_Allocator + 4);
        pvVar22 = (void *)((long)pvVar22 + (long)iVar17 * sVar12);
      } while (lVar18 != 0x40);
      uVar32 = uVar32 + 1;
      pAVar28 = (Allocator *)((long)&pAVar28->_vptr_Allocator + lVar25);
      pAVar21 = (Allocator *)((long)&pAVar21->_vptr_Allocator + lVar25);
      pAVar31 = (Allocator *)((long)&pAVar31->_vptr_Allocator + lVar25);
      pAVar27 = (Allocator *)((long)&pAVar27->_vptr_Allocator + lVar25);
      uVar29 = (ulong)((uint)uVar29 + 1);
    } while (uVar32 != uVar35);
  }
  piVar14 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      local_138 = (ulong)(uint)inch;
      if (local_198.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_198.data != (Allocator *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack4to1_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 4a-inch/4a-64-outch;
    kernel_tm_pack4.create(4 * inch / 4, 64, outch / 4 + outch % 4, (size_t)4u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        const Mat k0 = kernel_tm.channel(p);
        const Mat k1 = kernel_tm.channel(p + 1);
        const Mat k2 = kernel_tm.channel(p + 2);
        const Mat k3 = kernel_tm.channel(p + 3);

        Mat g0 = kernel_tm_pack4.channel(p / 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 3 < inch; q += 4)
            {
                const float* k00 = k0.row(q);
                const float* k01 = k0.row(q + 1);
                const float* k02 = k0.row(q + 2);
                const float* k03 = k0.row(q + 3);

                const float* k10 = k1.row(q);
                const float* k11 = k1.row(q + 1);
                const float* k12 = k1.row(q + 2);
                const float* k13 = k1.row(q + 3);

                const float* k20 = k2.row(q);
                const float* k21 = k2.row(q + 1);
                const float* k22 = k2.row(q + 2);
                const float* k23 = k2.row(q + 3);

                const float* k30 = k3.row(q);
                const float* k31 = k3.row(q + 1);
                const float* k32 = k3.row(q + 2);
                const float* k33 = k3.row(q + 3);

                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00[4] = k01[k];
                g00[5] = k11[k];
                g00[6] = k21[k];
                g00[7] = k31[k];

                g00[8] = k02[k];
                g00[9] = k12[k];
                g00[10] = k22[k];
                g00[11] = k32[k];

                g00[12] = k03[k];
                g00[13] = k13[k];
                g00[14] = k23[k];
                g00[15] = k33[k];

                g00 += 16;
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack4.channel(p / 4 + p % 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 3 < inch; q += 4)
            {
                const float* k00 = k0.row(q);
                const float* k01 = k0.row(q + 1);
                const float* k02 = k0.row(q + 2);
                const float* k03 = k0.row(q + 3);

                g00[0] = k00[k];
                g00[1] = k01[k];
                g00[2] = k02[k];
                g00[3] = k03[k];

                g00 += 4;
            }
        }
    }
}